

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O1

optional<jbcoin::detail::STVar> *
jbcoin::STParsedJSONDetail::parseArray
          (optional<jbcoin::detail::STVar> *__return_storage_ptr__,string *json_name,Value *json,
          SField *inName,int depth,Value *error)

{
  atomic<int> *paVar1;
  ValueHolder VVar2;
  ushort uVar3;
  string *object;
  char cVar4;
  char cVar5;
  UInt UVar6;
  UInt UVar7;
  Value *pVVar8;
  SField *inName_00;
  ostream *poVar9;
  Counter *pCVar10;
  _Rb_tree_header *p_Var11;
  long *plVar12;
  undefined4 extraout_var;
  ValueHolder *pVVar13;
  undefined8 *puVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong *puVar16;
  size_type *psVar17;
  uint uVar18;
  undefined8 uVar19;
  ulong uVar20;
  ushort uVar21;
  ulong uVar22;
  bool bVar23;
  string errMsg;
  string objectName;
  optional<jbcoin::STObject> ret;
  STArray tail;
  Value objectFields;
  stringstream ss;
  string local_320;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0;
  long lStack_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  ulong *local_2a0;
  uint local_298;
  undefined4 uStack_294;
  ulong local_290 [2];
  undefined1 local_280 [56];
  string *local_248;
  ValueHolder local_240;
  long local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  ValueHolder local_220;
  ushort local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  ValueHolder local_200;
  ushort local_1f8;
  undefined6 uStack_1f6;
  ValueHolder local_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  Value local_1d8;
  ValueHolder local_1c8;
  ushort local_1c0;
  ValueHolder local_1b8;
  long local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 uStack_198;
  ValueHolder *local_168;
  ios_base local_138 [264];
  
  if ((json->field_0x8 != '\0') && (json->field_0x8 != '\x06')) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                   "Field \'",json_name);
    plVar12 = (long *)std::__cxx11::string::append((char *)local_280);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 == paVar15) {
      local_1a8._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_1a8._8_8_ = plVar12[3];
      local_1b8.string_ = (char *)&local_1a8;
    }
    else {
      local_1a8._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_1b8.string_ = (char *)*plVar12;
    }
    local_1b0 = plVar12[1];
    *plVar12 = (long)paVar15;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    RPC::make_error((RPC *)&local_200.bool_,rpcINVALID_PARAMS,(string *)&local_1b8);
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8.string_,local_1a8._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
    VVar2 = error->value_;
    pVVar13 = &local_200;
    error->value_ = local_200;
    uVar3 = *(ushort *)&error->field_0x8;
    *(ushort *)&error->field_0x8 = uVar3 & 0xff00 | local_1f8 & 0xff;
    *(ushort *)&error->field_0x8 = uVar3 & 0xfe00 | local_1f8 & 0xff | local_1f8 & 0x100;
    local_1f8 = local_1f8 & 0xfe00 | uVar3 & 0xff | uVar3 & 0x100;
    local_200 = VVar2;
LAB_001b7db2:
    Json::Value::~Value((Value *)pVVar13);
    (__return_storage_ptr__->super_type).m_initialized = false;
    return __return_storage_ptr__;
  }
  if (0x40 < depth) {
    pVVar13 = &local_1b8;
    too_deep((STParsedJSONDetail *)&pVVar13->bool_,json_name);
    VVar2 = error->value_;
    error->value_ = local_1b8;
    uVar3 = *(ushort *)&error->field_0x8;
    *(ushort *)&error->field_0x8 = uVar3 & 0xff00 | (ushort)local_1b0 & 0xff;
    *(ushort *)&error->field_0x8 =
         uVar3 & 0xfe00 | (ushort)local_1b0 & 0xff | (ushort)local_1b0 & 0x100;
    local_1b0 = CONCAT62((int6)((ulong)local_1b0 >> 0x10),
                         (ushort)local_1b0 & 0xfe00 | uVar3 & 0xff | uVar3 & 0x100);
    local_1b8 = VVar2;
    goto LAB_001b7db2;
  }
  local_248 = json_name;
  STArray::STArray((STArray *)&local_200,inName);
  UVar6 = Json::Value::size(json);
  if (UVar6 != 0) {
    uVar22 = 0;
    do {
      UVar6 = (UInt)uVar22;
      pVVar8 = Json::Value::operator[](json,UVar6);
      uVar3 = *(ushort *)&pVVar8->field_0x8;
      cVar5 = (char)uVar3;
      if ((cVar5 == '\a') || (cVar5 == '\0')) {
        pVVar8 = Json::Value::operator[](json,UVar6);
        UVar7 = Json::Value::size(pVVar8);
        bVar23 = UVar7 != 1;
      }
      else {
        bVar23 = false;
      }
      object = local_248;
      if ((bool)((cVar5 != '\0' && (uVar3 & 0xff) != 7) | bVar23)) {
        std::operator+(&local_2e0,"Field \'",local_248);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        puVar16 = (ulong *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar16) {
          local_320.field_2._M_allocated_capacity = *puVar16;
          local_320.field_2._8_8_ = plVar12[3];
        }
        else {
          local_320.field_2._M_allocated_capacity = *puVar16;
          local_320._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_320._M_string_length = plVar12[1];
        *plVar12 = (long)puVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        cVar5 = '\x01';
        if (uVar22 < 10) goto LAB_001b82cc;
        cVar4 = '\x04';
        goto LAB_001b7ff8;
      }
      pVVar8 = Json::Value::operator[](json,UVar6);
      Json::Value::getMemberNames_abi_cxx11_((Members *)&local_1b8,pVVar8);
      local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,*(size_type *)local_1b8.string_,
                 *(size_type *)
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_1b8.map_)->_M_t)->_M_local_buf + 8) + *(size_type *)local_1b8.string_
                );
      beast::unit_test::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1b8);
      inName_00 = SField::getField(&local_2c0);
      if (inName_00->fieldCode == sfInvalid) {
        unknown_field((STParsedJSONDetail *)&local_1b8.bool_,object,&local_2c0);
        VVar2 = error->value_;
        (error->value_).map_ = (ObjectValues *)local_1b8;
        uVar3 = *(ushort *)&error->field_0x8;
        *(ushort *)&error->field_0x8 = uVar3 & 0xff00 | (ushort)local_1b0 & 0xff;
        *(ushort *)&error->field_0x8 =
             uVar3 & 0xfe00 | (ushort)local_1b0 & 0xff | (ushort)local_1b0 & 0x100;
        local_1b0 = CONCAT62((int6)((ulong)local_1b0 >> 0x10),
                             (ushort)local_1b0 & 0xfe00 | uVar3 & 0xff | uVar3 & 0x100);
        local_1b8 = VVar2;
        Json::Value::~Value((Value *)&local_1b8);
        (__return_storage_ptr__->super_type).m_initialized = false;
        goto LAB_001b8804;
      }
      pVVar8 = Json::Value::operator[](json,UVar6);
      pVVar8 = Json::Value::operator[](pVVar8,local_2c0._M_dataplus._M_p);
      Json::Value::Value(&local_1d8,pVVar8);
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8.bool_);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,(object->_M_dataplus)._M_p,object->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"[",1);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"].",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
      std::__cxx11::stringbuf::str();
      parseObject((optional<jbcoin::STObject> *)local_280,&local_320,&local_1d8,inName_00,depth + 1,
                  error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if (local_280[0] == false) {
        pVVar8 = Json::Value::resolveReference(error,"error_message",false);
        Json::Value::asString_abi_cxx11_(&local_320,pVVar8);
        std::__cxx11::stringbuf::str();
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,0x2838b5);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 == paVar15) {
          local_230._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_230._8_8_ = plVar12[3];
          local_240.string_ = (char *)&local_230;
        }
        else {
          local_230._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_240.string_ = (char *)*plVar12;
        }
        local_238 = plVar12[1];
        *plVar12 = (long)paVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_240.int_);
        puVar16 = (ulong *)(plVar12 + 2);
        if ((ulong *)*plVar12 == puVar16) {
          local_2f0 = *puVar16;
          lStack_2e8 = plVar12[3];
          local_300 = &local_2f0;
        }
        else {
          local_2f0 = *puVar16;
          local_300 = (ulong *)*plVar12;
        }
        local_2f8 = plVar12[1];
        *plVar12 = (long)puVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_300,(ulong)local_320._M_dataplus._M_p);
        psVar17 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_2e0.field_2._M_allocated_capacity = *psVar17;
          local_2e0.field_2._8_8_ = puVar14[3];
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *psVar17;
          local_2e0._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_2e0._M_string_length = puVar14[1];
        *puVar14 = psVar17;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        uVar21 = local_218 & 0xfe00;
        local_218 = uVar21 + 0x104;
        Json::valueAllocator();
        local_220._0_4_ =
             (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                       (Json::valueAllocator::valueAllocator,local_2e0._M_dataplus._M_p,
                        local_2e0._M_string_length & 0xffffffff);
        local_220._4_4_ = extraout_var;
        pVVar13 = &Json::Value::resolveReference(error,"error_message",false)->value_;
        VVar2 = *pVVar13;
        *pVVar13 = local_220;
        uVar3 = *(ushort *)(pVVar13 + 1);
        pVVar13[1].bool_ = true;
        *(ushort *)(pVVar13 + 1) = uVar3 & 0xff04 | 0x104;
        local_218 = uVar3 & 0x100 | uVar21 | uVar3 & 0xff;
        local_220 = VVar2;
        Json::Value::~Value((Value *)&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300,local_2f0 + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240.string_,local_230._M_allocated_capacity + 1);
        }
        if (local_2a0 != local_290) {
          operator_delete(local_2a0,local_290[0] + 1);
        }
        (__return_storage_ptr__->super_type).m_initialized = false;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001b87b7;
      }
      if (*(int *)(local_280._16_8_ + 4) != 0xe) {
        std::__cxx11::stringbuf::str();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_240,"Item \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_220);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_240.int_);
        puVar16 = (ulong *)(plVar12 + 2);
        if ((ulong *)*plVar12 == puVar16) {
          local_2f0 = *puVar16;
          lStack_2e8 = plVar12[3];
          local_300 = &local_2f0;
        }
        else {
          local_2f0 = *puVar16;
          local_300 = (ulong *)*plVar12;
        }
        local_2f8 = plVar12[1];
        *plVar12 = (long)puVar16;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        cVar5 = '\x01';
        if (uVar22 < 10) goto LAB_001b853b;
        cVar4 = '\x04';
        goto LAB_001b8285;
      }
      std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::
      emplace_back<jbcoin::STObject>
                ((vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_> *)&local_1f0,
                 (STObject *)(local_280 + 8));
      if (local_280[0] == true) {
        STObject::~STObject((STObject *)(local_280 + 8));
        local_280._0_8_ = local_280._0_8_ & 0xffffffffffffff00;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8.bool_);
      std::ios_base::~ios_base(local_138);
      Json::Value::~Value(&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      uVar22 = uVar22 + 1;
      UVar6 = Json::Value::size(json);
    } while (uVar22 < UVar6);
  }
  local_168 = (ValueHolder *)0x0;
  local_1b0 = CONCAT62(uStack_1f6,local_1f8);
  local_1b8.real_ = (double)&PTR__STBase_002d6fc0;
  pCVar10 = CountedObject<jbcoin::STArray>::getCounter();
  LOCK();
  paVar1 = &(pCVar10->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_1b8.real_ = (double)&PTR__STArray_002d6ed8;
  local_1a8._M_allocated_capacity = (size_type)local_1f0;
  local_1a8._8_8_ = uStack_1e8;
  uStack_198 = uStack_1e0;
  local_1f0.real_ = 0.0;
  uStack_1e8 = 0;
  uStack_1e0 = 0;
  (__return_storage_ptr__->super_type).m_initialized = false;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x50) = 0;
  *(undefined ***)&(__return_storage_ptr__->super_type).m_storage.dummy_ = &PTR__STBase_002d6fc0;
  *(long *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) = local_1b0;
  local_168 = &local_1b8;
  pCVar10 = CountedObject<jbcoin::STArray>::getCounter();
  LOCK();
  paVar1 = &(pCVar10->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  *(undefined ***)&(__return_storage_ptr__->super_type).m_storage.dummy_ = &PTR__STArray_002d6ed8;
  *(size_type *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10) =
       local_1a8._M_allocated_capacity;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x18) =
       local_1a8._8_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x20) = uStack_198;
  local_1a8._M_allocated_capacity = 0;
  local_1a8._8_8_ = 0;
  uStack_198 = 0;
  *(storage_type **)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x50) =
       &(__return_storage_ptr__->super_type).m_storage;
  (__return_storage_ptr__->super_type).m_initialized = true;
  if (local_168 == &local_1b8) {
    p_Var11 = (_Rb_tree_header *)local_168->string_;
  }
  else {
    if (local_168 == (ValueHolder *)0x0) goto LAB_001b8826;
    p_Var11 = &(local_168->map_->_M_t)._M_impl.super__Rb_tree_header;
  }
  (**(code **)&p_Var11->_M_header)();
  goto LAB_001b8826;
  while( true ) {
    if (uVar18 < 10000) goto LAB_001b82cc;
    uVar22 = (uVar22 & 0xffffffff) / 10000;
    cVar4 = cVar5 + '\x04';
    if (uVar18 < 100000) break;
LAB_001b7ff8:
    cVar5 = cVar4;
    uVar18 = (uint)uVar22;
    if (uVar18 < 100) {
      cVar5 = cVar5 + -2;
      goto LAB_001b82cc;
    }
    if (uVar18 < 1000) {
      cVar5 = cVar5 + -1;
      goto LAB_001b82cc;
    }
  }
  cVar5 = cVar5 + '\x01';
LAB_001b82cc:
  local_300 = &local_2f0;
  std::__cxx11::string::_M_construct((ulong)&local_300,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_300,(uint)local_2f8,UVar6);
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    uVar19 = local_320.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_2f8 + local_320._M_string_length) {
    uVar22 = 0xf;
    if (local_300 != &local_2f0) {
      uVar22 = local_2f0;
    }
    if (uVar22 < local_2f8 + local_320._M_string_length) goto LAB_001b833e;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_300,0,(char *)0x0,(ulong)local_320._M_dataplus._M_p);
  }
  else {
LAB_001b833e:
    puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_300);
  }
  local_280._0_8_ = local_280 + 0x10;
  psVar17 = puVar14 + 2;
  if ((size_type *)*puVar14 == psVar17) {
    local_280._16_8_ = *psVar17;
    local_280._24_8_ = puVar14[3];
  }
  else {
    local_280._16_8_ = *psVar17;
    local_280._0_8_ = (size_type *)*puVar14;
  }
  local_280._8_8_ = *(type *)(puVar14 + 1);
  *puVar14 = psVar17;
  puVar14[1] = 0;
  *(undefined1 *)psVar17 = 0;
  puVar14 = (undefined8 *)std::__cxx11::string::append(local_280);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 == paVar15) {
    local_1a8._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_1a8._8_8_ = puVar14[3];
    local_1b8.string_ = (char *)&local_1a8;
  }
  else {
    local_1a8._M_allocated_capacity = paVar15->_M_allocated_capacity;
    local_1b8.string_ = (char *)*puVar14;
  }
  local_1b0 = puVar14[1];
  *puVar14 = paVar15;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  RPC::make_error((RPC *)&local_240.bool_,rpcINVALID_PARAMS,(string *)&local_1b8);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8.string_,local_1a8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  VVar2 = error->value_;
  error->value_ = local_240;
  uVar3 = *(ushort *)&error->field_0x8;
  *(ushort *)&error->field_0x8 = uVar3 & 0xff00 | (ushort)local_238 & 0xff;
  *(ushort *)&error->field_0x8 =
       uVar3 & 0xfe00 | (ushort)local_238 & 0xff | (ushort)local_238 & 0x100;
  local_238 = CONCAT62((int6)((ulong)local_238 >> 0x10),
                       (ushort)local_238 & 0xfe00 | uVar3 & 0xff | uVar3 & 0x100);
  local_240 = VVar2;
  Json::Value::~Value((Value *)&local_240);
  (__return_storage_ptr__->super_type).m_initialized = false;
  goto LAB_001b8826;
  while( true ) {
    if (uVar18 < 10000) goto LAB_001b853b;
    uVar22 = (uVar22 & 0xffffffff) / 10000;
    cVar4 = cVar5 + '\x04';
    if (uVar18 < 100000) break;
LAB_001b8285:
    cVar5 = cVar4;
    uVar18 = (uint)uVar22;
    if (uVar18 < 100) {
      cVar5 = cVar5 + -2;
      goto LAB_001b853b;
    }
    if (uVar18 < 1000) {
      cVar5 = cVar5 + -1;
      goto LAB_001b853b;
    }
  }
  cVar5 = cVar5 + '\x01';
LAB_001b853b:
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct((ulong)&local_2a0,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2a0,local_298,UVar6);
  uVar22 = CONCAT44(uStack_294,local_298) + local_2f8;
  uVar20 = 0xf;
  if (local_300 != &local_2f0) {
    uVar20 = local_2f0;
  }
  if (uVar20 < uVar22) {
    uVar20 = 0xf;
    if (local_2a0 != local_290) {
      uVar20 = local_290[0];
    }
    if (uVar20 < uVar22) goto LAB_001b85ba;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,(ulong)local_300);
  }
  else {
LAB_001b85ba:
    puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_2a0);
  }
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  psVar17 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_2e0.field_2._M_allocated_capacity = *psVar17;
    local_2e0.field_2._8_8_ = puVar14[3];
  }
  else {
    local_2e0.field_2._M_allocated_capacity = *psVar17;
    local_2e0._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_2e0._M_string_length = puVar14[1];
  *puVar14 = psVar17;
  puVar14[1] = 0;
  *(undefined1 *)psVar17 = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  puVar16 = (ulong *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar16) {
    local_320.field_2._M_allocated_capacity = *puVar16;
    local_320.field_2._8_8_ = plVar12[3];
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  }
  else {
    local_320.field_2._M_allocated_capacity = *puVar16;
    local_320._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_320._M_string_length = plVar12[1];
  *plVar12 = (long)puVar16;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  RPC::make_error((RPC *)&local_1c8.bool_,rpcINVALID_PARAMS,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240.string_,local_230._M_allocated_capacity + 1);
  }
  VVar2 = error->value_;
  error->value_ = local_1c8;
  uVar3 = *(ushort *)&error->field_0x8;
  *(ushort *)&error->field_0x8 = uVar3 & 0xff00 | local_1c0 & 0xff;
  *(ushort *)&error->field_0x8 = uVar3 & 0xfe00 | local_1c0 & 0xff | local_1c0 & 0x100;
  local_1c0 = local_1c0 & 0xfe00 | uVar3 & 0xff | uVar3 & 0x100;
  local_1c8 = VVar2;
  Json::Value::~Value((Value *)&local_1c8);
  if (local_220 != &local_210) {
    operator_delete(local_220.string_,local_210._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->super_type).m_initialized = false;
LAB_001b87b7:
  if (local_280[0] == true) {
    STObject::~STObject((STObject *)(local_280 + 8));
    local_280._0_8_ = local_280._0_8_ & 0xffffffffffffff00;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8.bool_);
  std::ios_base::~ios_base(local_138);
  Json::Value::~Value(&local_1d8);
LAB_001b8804:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
LAB_001b8826:
  std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::~vector
            ((vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_> *)&local_1f0);
  pCVar10 = CountedObject<jbcoin::STArray>::getCounter();
  LOCK();
  paVar1 = &(pCVar10->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  return __return_storage_ptr__;
}

Assistant:

static boost::optional <detail::STVar> parseArray (
    std::string const& json_name,
    Json::Value const& json,
    SField const& inName,
    int depth,
    Json::Value& error)
{
    if (! json.isArray ())
    {
        error = not_an_array (json_name);
        return boost::none;
    }

    if (depth > maxDepth)
    {
        error = too_deep (json_name);
        return boost::none;
    }

    try
    {
        STArray tail (inName);

        for (Json::UInt i = 0; json.isValidIndex (i); ++i)
        {
            bool const isObject (json[i].isObject());
            bool const singleKey (isObject ? json[i].size() == 1 : true);

            if (!isObject || !singleKey)
            {
                error = singleton_expected (json_name, i);
                return boost::none;
            }

            // TODO: There doesn't seem to be a nice way to get just the
            // first/only key in an object without copying all keys into
            // a vector
            std::string const objectName (json[i].getMemberNames()[0]);;
            auto const&       nameField (SField::getField(objectName));

            if (nameField == sfInvalid)
            {
                error = unknown_field (json_name, objectName);
                return boost::none;
            }

            Json::Value const objectFields (json[i][objectName]);

            std::stringstream ss;
            ss << json_name << "." <<
                "[" << i << "]." << objectName;

            auto ret = parseObject (ss.str (), objectFields,
                nameField, depth + 1, error);
            if (! ret)
            {
                    std::string errMsg = error["error_message"].asString ();
                    error["error_message"] = "Error at '" + ss.str () +
                        "'. " + errMsg;
                    return boost::none;
            }

            if (ret->getFName().fieldType != STI_OBJECT)
            {
                error = non_object_in_array (ss.str(), i);
                return boost::none;
            }

            tail.push_back (std::move (*ret));
        }

        return detail::make_stvar <STArray> (std::move (tail));
    }
    catch (std::exception const&)
    {
        error = invalid_data (json_name);
        return boost::none;
    }
}